

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sockets.cpp
# Opt level: O2

ssize_t __thiscall Socket::read(Socket *this,int __fd,void *__buf,size_t __nbytes)

{
  int __errnum;
  bool bVar1;
  ssize_t sVar2;
  int *piVar3;
  ostream *poVar4;
  char *pcVar5;
  runtime_error *this_00;
  void *__n;
  uint uVar6;
  undefined4 in_register_00000034;
  string local_1c0;
  stringstream stream;
  ostream local_190 [376];
  
  bVar1 = Select(this,(timeval *)__nbytes);
  if (bVar1) {
    __n = (void *)0x7fffffff;
    if (__buf < (void *)0x7fffffff) {
      __n = __buf;
    }
    sVar2 = recv(this->m_Socket,(void *)CONCAT44(in_register_00000034,__fd),(size_t)__n,0);
    uVar6 = (uint)sVar2;
    if (0 < (int)uVar6) {
      return (ulong)(uVar6 & 0x7fffffff);
    }
    piVar3 = __errno_location();
    if (((uVar6 == 0) || (__errnum = *piVar3, __errnum == 0x6b)) || (__errnum == 0x67)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"connection closed by remote");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    poVar4 = std::operator<<(local_190,"read frame failed with error: ");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
    pcVar5 = strerror(__errnum);
    std::operator<<(poVar4,pcVar5);
    std::__cxx11::stringbuf::str();
    Logger::Log(3,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  }
  return 0;
}

Assistant:

size_t Socket::read(uint8_t* buffer, size_t maxBytes, timeval* timeout) const
{
    if (!Select(timeout)) {
        return 0;
    }

    const auto msvcMaxBytes = static_cast<int>(std::min<size_t>(std::numeric_limits<int>::max(), maxBytes));
    const int bytesRead = recv(m_Socket, reinterpret_cast<char*>(buffer), msvcMaxBytes, 0);
    if (bytesRead > 0) {
        return bytesRead;
    }
    const auto lastError = WSAGetLastError();
    if ((0 == bytesRead) || (lastError == CONNECTION_CLOSED) || (lastError == CONNECTION_ABORTED)) {
        throw std::runtime_error("connection closed by remote");
    } else {
        LOG_ERROR("read frame failed with error: " << std::dec << std::strerror(lastError));
    }
    return 0;
}